

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

type_t flecs::_::component_info<Rocket>::type(world_t *world)

{
  world_t *world_local;
  
  if (s_id == 0) {
    id(world,(char *)0x0,true);
  }
  _ecs_assert(s_id != 0,0xc,(char *)0x0,"s_id != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xe3c);
  if (s_id == 0) {
    __assert_fail("s_id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                  ,0xe3c,
                  "static type_t flecs::_::component_info<Rocket>::type(world_t *) [T = Rocket]");
  }
  if (s_type == (ecs_type_t)0x0) {
    s_type = ecs_type_from_entity(world,s_id);
  }
  _ecs_assert(s_type != (ecs_type_t)0x0,0xc,(char *)0x0,"s_type != nullptr",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
              ,0xe43);
  if (s_type != (ecs_type_t)0x0) {
    return s_type;
  }
  __assert_fail("s_type != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/include/flecs/flecs.hpp"
                ,0xe43,
                "static type_t flecs::_::component_info<Rocket>::type(world_t *) [T = Rocket]");
}

Assistant:

static type_t type(world_t *world = nullptr) {
        // If no id has been registered yet, do it now.
        if (!s_id) {
            id(world);
        }

        // By now we should have a valid identifier
        ecs_assert(s_id != 0, ECS_INTERNAL_ERROR, NULL);        

        // Create a type from the component id.
        if (!s_type) {
            s_type = ecs_type_from_entity(world, s_id);
        }

        ecs_assert(s_type != nullptr, ECS_INTERNAL_ERROR, NULL);

        return s_type;
    }